

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitMinus(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
           *this,UnaryExpr e)

{
  Buffer<char> *pBVar1;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> e_00;
  size_t sVar2;
  
  pBVar1 = this->writer_->buffer_;
  sVar2 = pBVar1->size_;
  if (sVar2 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar2 + 1);
    sVar2 = pBVar1->size_;
  }
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = '-';
  e_00 = internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                   (*(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.
                                     super_ExprBase.impl_ + 8));
  Visit(this,(NumericExpr)e_00.super_ExprBase.impl_,-1);
  return;
}

Assistant:

void VisitMinus(UnaryExpr e) {
    writer_ << '-';
    Visit(e.arg());
  }